

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v8::detail::
     value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>
     ::
     format_custom_arg<jessilib::io::ansi::text_wrapper,fmt::v8::formatter<jessilib::io::ansi::text_wrapper,char8_t,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>
               *ctx)

{
  undefined8 this;
  iterator it;
  iterator it_00;
  undefined1 local_60 [8];
  formatter<jessilib::io::ansi::text_wrapper,_char8_t,_void> f;
  basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>
  *ctx_local;
  parse_context_type *parse_ctx_local;
  void *arg_local;
  
  f.
  super_formatter<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_char8_t,_void>
  .super_formatter<fmt::v8::basic_string_view<char8_t>,_char8_t,_void>.specs_.precision_ref.val.name
  .size_ = (size_t)ctx;
  memset(local_60,0,0x40);
  formatter<jessilib::io::ansi::text_wrapper,_char8_t,_void>::formatter
            ((formatter<jessilib::io::ansi::text_wrapper,_char8_t,_void> *)local_60);
  it = formatter<fmt::v8::basic_string_view<char8_t>,char8_t,void>::
       parse<fmt::v8::basic_format_parse_context<char8_t,fmt::v8::detail::error_handler>>
                 ((formatter<fmt::v8::basic_string_view<char8_t>,char8_t,void> *)local_60,parse_ctx)
  ;
  basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler>::advance_to(parse_ctx,it);
  this = f.
         super_formatter<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_char8_t,_void>
         .super_formatter<fmt::v8::basic_string_view<char8_t>,_char8_t,_void>.specs_.precision_ref.
         val.name.size_;
  it_00 = formatter<jessilib::io::ansi::text_wrapper,char8_t,void>::
          format<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>
                    ((formatter<jessilib::io::ansi::text_wrapper,char8_t,void> *)local_60,
                     (text_wrapper *)arg,
                     (basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>
                      *)f.
                        super_formatter<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_char8_t,_void>
                        .super_formatter<fmt::v8::basic_string_view<char8_t>,_char8_t,_void>.specs_.
                        precision_ref.val.name.size_);
  basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>::
  advance_to((basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>
              *)this,it_00);
  return;
}

Assistant:

static void format_custom_arg(void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_const_formatter<T, Context>(), const T, T>;
    ctx.advance_to(f.format(*static_cast<qualified_type*>(arg), ctx));
  }